

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::Matcher
          (Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> *this,
          pair<phmap::priv::hash_internal::EnumClass,_int> *value)

{
  int iVar1;
  EnumClass EVar2;
  MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> local_38;
  
  (this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>).buffer_.
  ptr = (void *)0x0;
  (this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00325aa8;
  EVar2 = value->first;
  iVar1 = value->second;
  local_38.vtable_ =
       (VTable *)
       internal::MatcherBase<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>::
       GetVTable<testing::internal::MatcherBase<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>::ValuePolicy<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,int>>,false>>()
       ::kVTable;
  local_38.buffer_.ptr = operator_new(0x18);
  ((local_38.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(EnumClass *)(local_38.buffer_.i + 8) = EVar2;
  *(int *)(local_38.buffer_.i + 0x10) = iVar1;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00325aa8;
  internal::MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::operator=
            (&this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>
             ,&local_38);
  internal::MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::~MatcherBase
            (&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}